

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_interpreted_light.hpp
# Opt level: O3

void * __thiscall
randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,false>::operator_new
          (InterpretedLightVm<randomx::AlignedAllocator<64ul>,false> *this,size_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = AlignedAllocator<64UL>::allocMemory((size_t)this);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::ios::widen;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* operator new(size_t size) {
			void* ptr = AlignedAllocator<CacheLineSize>::allocMemory(size);
			if (ptr == nullptr)
				throw std::bad_alloc();
			return ptr;
		}